

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

void fiord(mcmcxdef *mctx,voccxdef *vctx,tokcxdef *tctx,char *fname,char *exename,
          fiolcxdef *setupctx,objnum *preinit,uint *flagp,tokpdef *path,uchar **fmtsp,uint *fmtlp,
          uint *pcntptr,int flags,appctxdef *appctx,char *argv0)

{
  int *piVar1;
  ushort uVar2;
  ushort uVar3;
  dbgcxdef *pdVar4;
  char cVar5;
  objnum oVar6;
  uint uVar7;
  int iVar8;
  int resfileno;
  size_t sVar9;
  FILE *pFVar10;
  ulong uVar11;
  size_t sVar12;
  ulong __off;
  tokthdef *toktab1;
  long lVar13;
  byte *pbVar14;
  ushort *__ptr;
  size_t sVar15;
  uchar *puVar16;
  runxdef *prVar17;
  ulong uVar18;
  char *filename;
  char *pcVar19;
  uint uVar20;
  char *pcVar21;
  byte *pbVar22;
  ulong uVar23;
  ushort *__ptr_00;
  uint inc;
  byte *pbVar24;
  mclhd loadhd;
  errcxdef *ctx;
  uint uVar25;
  ulong uVar26;
  ushort *puVar27;
  char suffix_uc [4];
  char suffix_lc [4];
  undefined1 local_11c8 [4];
  int iStack_11c4;
  undefined5 uStack_11c0;
  undefined4 local_11bb;
  undefined3 uStack_11b7;
  char resname [4096];
  errdef fr_;
  
  *preinit = 0xffff;
  pcVar19 = fname;
  if (fname == (char *)0x0) {
    pcVar19 = exename;
  }
  if (pcVar19 == (char *)0x0) {
    G_os_gamename[0] = '\0';
  }
  else {
    sVar9 = strlen(pcVar19);
    sVar12 = 0xfff;
    if (sVar9 < 0xfff) {
      sVar12 = sVar9;
    }
    memcpy(G_os_gamename,pcVar19,sVar12);
    G_os_gamename[sVar12] = '\0';
  }
  if (fname == (char *)0x0) {
    pFVar10 = (FILE *)os_exeseek(exename,"TGAM");
  }
  else {
    pFVar10 = fopen(fname,"rb");
  }
  if (pFVar10 == (FILE *)0x0) {
    errsigf(vctx->voccxerr,"TADS",0x25e);
  }
  if ((appctx != (appctxdef *)0x0) && (appctx->set_game_name != (_func_void_void_ptr_char_ptr *)0x0)
     ) {
    (*appctx->set_game_name)(appctx->set_game_name_ctx,pcVar19);
  }
  uVar11 = ftell(pFVar10);
  fr_.errcode = _setjmp((__jmp_buf_tag *)fr_.errbuf);
  if (fr_.errcode != 0) {
    vctx->voccxerr->errcxptr = fr_.errprv;
    fclose(pFVar10);
    errrse1(vctx->voccxerr,&fr_);
  }
  fr_.errprv = vctx->voccxerr->errcxptr;
  vctx->voccxerr->errcxptr = &fr_;
  ctx = vctx->voccxerr;
  setupctx->fiolcxfp = (osfildef *)pFVar10;
  setupctx->fiolcxerr = ctx;
  setupctx->fiolcxst = uVar11;
  setupctx->fiolcxseed = 0x11;
  setupctx->fiolcxinc = 0x1d;
  sVar12 = fread(resname,0x16,1,pFVar10);
  if (sVar12 == 1) {
    if (CONCAT26(resname._11_2_,
                 CONCAT15(resname[10],
                          CONCAT14(resname[9],
                                   CONCAT13(resname[8],
                                            CONCAT12(resname[7],CONCAT11(resname[6],resname[5]))))))
        != 0x1a0d0a6e696220 ||
        CONCAT17(resname[7],
                 CONCAT16(resname[6],
                          CONCAT15(resname[5],
                                   CONCAT14(resname[4],
                                            CONCAT13(resname[3],
                                                     CONCAT12(resname[2],
                                                              CONCAT11(resname[1],resname[0])))))))
        != 0x6962203253444154) {
      errsigf(ctx,"TADS",0x260);
    }
    if (((CONCAT22(resname._18_2_,CONCAT11(resname[0x11],resname[0x10])) != 0x302e32 ||
          CONCAT13(resname[0x10],CONCAT21(resname._14_2_,resname[0xd])) != 0x322e3276) &&
        (CONCAT22(resname._18_2_,CONCAT11(resname[0x11],resname[0x10])) != 0x302e30 ||
         CONCAT13(resname[0x10],CONCAT21(resname._14_2_,resname[0xd])) != 0x302e3276)) &&
       (CONCAT22(resname._18_2_,CONCAT11(resname[0x11],resname[0x10])) != 0x312e30 ||
        CONCAT13(resname[0x10],CONCAT21(resname._14_2_,resname[0xd])) != 0x302e3276)) {
LAB_0012a7d7:
      errsigf(ctx,"TADS",0x263);
    }
    sVar12 = fread(vctx->voccxtim,0x1a,1,pFVar10);
    if (sVar12 == 1) {
      if ((CONCAT22(resname._18_2_,CONCAT11(resname[0x11],resname[0x10])) == 0x302e30 &&
           CONCAT13(resname[0x10],CONCAT21(resname._14_2_,resname[0xd])) == 0x302e3276) ||
         (CONCAT22(resname._18_2_,CONCAT11(resname[0x11],resname[0x10])) == 0x312e30 &&
          CONCAT13(resname[0x10],CONCAT21(resname._14_2_,resname[0xd])) == 0x302e3276)) {
        *(byte *)&mctx->mcmcxflg = (byte)mctx->mcmcxflg | 1;
      }
      *flagp = resname._20_4_ & 0xffff;
      setupctx->fiolcxflg = resname._20_4_ & 0xffff;
      uVar20 = 0x11;
      inc = 0x1d;
      uVar18 = 0;
      __off = uVar18;
LAB_00128b13:
      sVar12 = fread(resname,1,1,pFVar10);
      if ((sVar12 != 1) ||
         (sVar12 = fread(resname + 1,(ulong)(byte)resname[0] + 4,1,pFVar10), sVar12 != 1))
      goto LAB_0012a6cd;
      uVar25 = *(uint *)(resname + (ulong)(byte)resname[0] + 1);
      uVar26 = (ulong)uVar25;
      if ((ulong)(byte)resname[0] == 3) {
        if (resname[3] != 'J' || CONCAT11(resname[2],resname[1]) != 0x424f) {
          if (resname[3] != 'T' || CONCAT11(resname[2],resname[1]) != 0x5346) goto LAB_00128bb5;
          if ((*flagp & 0x20) == 0) {
            uVar23 = uVar26 + uVar11;
            uVar26 = __off;
          }
          else {
            lVar13 = ftell(pFVar10);
            uVar23 = lVar13 - uVar11;
            sVar12 = uVar26 - uVar23;
            if ((sVar12 - 1 < 0xfffffffe) &&
               (pbVar14 = (byte *)malloc(sVar12), pbVar14 != (byte *)0x0)) {
              pbVar22 = pbVar14;
              uVar23 = sVar12;
              if (sVar12 != 0) {
                do {
                  sVar9 = 0xffff;
                  if (uVar23 < 0xffff) {
                    sVar9 = uVar23;
                  }
                  sVar15 = fread(pbVar22,sVar9,1,pFVar10);
                  if (sVar15 != 1) goto LAB_0012a6cd;
                  uVar23 = uVar23 - sVar9;
                  pbVar22 = pbVar22 + sVar9;
                  pbVar24 = pbVar14;
                } while (uVar23 != 0);
                do {
                  uVar3 = *(ushort *)(pbVar24 + 1);
                  if (*pbVar24 - 1 < 2) {
                    mcmrsrv(mctx,*(ushort *)(pbVar24 + 3),uVar3,(ulong)*(uint *)(pbVar24 + 7));
                    pbVar24 = pbVar24 + 0xb;
                    sVar12 = sVar12 - 0xb;
                    if ((flags & 2U) != 0) {
                      mcmlck(mctx,uVar3);
                      mcmunlck(mctx,uVar3);
                    }
                  }
                  else {
                    if (*pbVar24 != 10) {
LAB_0012a74e:
                      errsigf(ctx,"TADS",0x262);
                    }
                    prVar17 = vctx->voccxrun->runcxext;
                    if (prVar17 == (runxdef *)0x0) goto LAB_0012a77a;
                    pcVar21 = prVar17->runxnam + (uint)uVar3 * 0x30;
                    memcpy(pcVar21,pbVar24 + 4,(ulong)pbVar24[3]);
                    pcVar21[pbVar24[3]] = '\0';
                    sVar12 = sVar12 - ((ulong)pbVar24[3] + 4);
                    pbVar24 = pbVar24 + (ulong)pbVar24[3] + 4;
                  }
                } while (sVar12 != 0);
              }
              free(pbVar14);
              fseek(pFVar10,uVar11 + uVar26,0);
            }
            else {
              while (uVar26 != uVar23) {
                sVar12 = fread(resname,3,1,pFVar10);
                if (sVar12 != 1) goto LAB_0012a6cd;
                uVar3 = CONCAT11(resname[2],resname[1]);
                if ((byte)resname[0] - 1 < 2) {
                  sVar12 = fread(resname + 3,8,1,pFVar10);
                  if (sVar12 != 1) goto LAB_0012a6cd;
                  mcmrsrv(mctx,CONCAT11(resname[4],resname[3]),uVar3,
                          (ulong)CONCAT13(resname[10],
                                          CONCAT12(resname[9],CONCAT11(resname[8],resname[7]))));
                  uVar23 = uVar23 + 0xb;
                  if ((flags & 2U) != 0) {
                    mcmlck(mctx,uVar3);
                    mcmunlck(mctx,uVar3);
                    fseek(pFVar10,uVar23 + uVar11,0);
                  }
                }
                else {
                  if ((byte)resname[0] != 10) goto LAB_0012a74e;
                  prVar17 = vctx->voccxrun->runcxext;
                  if (prVar17 == (runxdef *)0x0) goto LAB_0012a77a;
                  sVar12 = fread(resname + 3,1,1,pFVar10);
                  if (sVar12 != 1) goto LAB_0012a6cd;
                  pcVar21 = prVar17->runxnam + (uint)uVar3 * 0x30;
                  sVar12 = fread(pcVar21,(ulong)(byte)resname[3],1,pFVar10);
                  if (sVar12 != 1) goto LAB_0012a6cd;
                  pcVar21[(byte)resname[3]] = '\0';
                  uVar23 = uVar23 + (byte)resname[3] + 4;
                }
              }
            }
            uVar23 = uVar18;
            if (uVar18 == 0) goto LAB_00128b13;
          }
          fseek(pFVar10,uVar23,0);
          __off = uVar26;
          goto LAB_00128b13;
        }
        if ((*flagp & 0x20) == 0) {
          lVar13 = ftell(pFVar10);
          loadhd = lVar13 - uVar11;
          while (loadhd != uVar26) {
            sVar12 = fread(resname,3,1,pFVar10);
            if (sVar12 != 1) goto LAB_0012a6cd;
            uVar3 = CONCAT11(resname[2],resname[1]);
            if ((byte)resname[0] - 1 < 2) {
              sVar12 = fread(resname + 3,4,1,pFVar10);
              if (sVar12 != 1) goto LAB_0012a6cd;
              mcmrsrv(mctx,CONCAT11(resname[4],resname[3]),uVar3,loadhd);
              uVar2 = CONCAT11(resname[6],resname[5]);
              if ((flags & 2U) != 0) {
                mcmlck(mctx,uVar3);
                mcmunlck(mctx,uVar3);
              }
              loadhd = loadhd + uVar2 + 7;
              fseek(pFVar10,loadhd + uVar11,0);
            }
            else if ((byte)resname[0] - 7 < 2) {
              sVar12 = fread(resname + 3,2,1,pFVar10);
              if (sVar12 != 1) goto LAB_0012a6cd;
              uVar2 = CONCAT11(resname[4],resname[3]);
              puVar16 = mcmalo0(mctx,uVar2,(mcmon *)0x0,uVar3,0);
              sVar12 = fread(puVar16,(ulong)uVar2,1,pFVar10);
              if (sVar12 != 1) goto LAB_0012a6cd;
              mcmunlck(mctx,uVar3);
              loadhd = loadhd + uVar2 + 5;
            }
            else {
              if (resname[0] != '\n') goto LAB_0012a74e;
              prVar17 = vctx->voccxrun->runcxext;
              if (prVar17 == (runxdef *)0x0) goto LAB_0012a77a;
              sVar12 = fread(resname + 3,1,1,pFVar10);
              if (sVar12 != 1) goto LAB_0012a6cd;
              pcVar21 = prVar17->runxnam + (uint)uVar3 * 0x30;
              sVar12 = fread(pcVar21,(ulong)(byte)resname[3],1,pFVar10);
              if (sVar12 != 1) goto LAB_0012a6cd;
              pcVar21[(byte)resname[3]] = '\0';
              loadhd = (byte)resname[3] + loadhd + 4;
            }
          }
        }
        else {
LAB_00128d24:
          fseek(pFVar10,uVar26 + uVar11,0);
        }
        goto LAB_00128b13;
      }
LAB_00128bb5:
      if ((resname[0] == '\x04') &&
         (CONCAT13(resname[4],CONCAT12(resname[3],CONCAT11(resname[2],resname[1]))) == 0x4e434658))
      {
        if (vctx->voccxrun->runcxext == (runxdef *)0x0) {
LAB_0012a77a:
          errsigf(ctx,"TADS",0x266);
        }
        sVar12 = fread(resname,3,1,pFVar10);
        if ((sVar12 != 1) ||
           (sVar12 = fread(resname + 3,(ulong)(byte)resname[2],1,pFVar10), sVar12 != 1))
        goto LAB_0012a6cd;
      }
      else {
        if ((resname[0] != '\a') ||
           (CONCAT13(resname[7],CONCAT12(resname[6],CONCAT11(resname[5],resname[4]))) != 0x5345524c
            || CONCAT13(resname[4],CONCAT12(resname[3],CONCAT11(resname[2],resname[1]))) !=
               0x4c4d5448)) {
          if (resname[0] == '\x03') {
            if (resname[3] == 'H' && CONCAT11(resname[2],resname[1]) == 0x4e49) {
              lVar13 = ftell(pFVar10);
              uVar23 = lVar13 - uVar11;
              sVar12 = uVar26 - uVar23;
              if ((sVar12 - 1 < 0xfffffffe) &&
                 (pbVar14 = (byte *)malloc(sVar12), pbVar14 != (byte *)0x0)) {
                pbVar22 = pbVar14;
                uVar26 = sVar12;
                if (sVar12 != 0) {
                  do {
                    sVar9 = 0xffff;
                    if (uVar26 < 0xffff) {
                      sVar9 = uVar26;
                    }
                    sVar15 = fread(pbVar22,sVar9,1,pFVar10);
                    if (sVar15 != 1) goto LAB_0012a6cd;
                    uVar26 = uVar26 - sVar9;
                    pbVar24 = pbVar14;
                    pbVar22 = pbVar22 + sVar9;
                  } while (uVar26 != 0);
                  do {
                    uVar3 = *(ushort *)(pbVar24 + 7);
                    uVar2 = *(ushort *)(pbVar24 + 1);
                    vociadd(vctx,uVar2,*(objnum *)(pbVar24 + 3),(uint)uVar3,(objnum *)(pbVar24 + 9),
                            *pbVar24 | 4);
                    (vctx->voccxinh[uVar2 >> 8][(ulong)uVar2 & 0xff]->vociu).vocius.vociusilc =
                         *(objnum *)(pbVar24 + 5);
                    sVar12 = sVar12 - ((ulong)uVar3 * 2 + 9);
                    pbVar24 = pbVar24 + (ulong)uVar3 * 2 + 9;
                  } while (sVar12 != 0);
                }
                free(pbVar14);
              }
              else if (uVar26 != uVar23) {
                do {
                  sVar12 = fread(resname,9,1,pFVar10);
                  cVar5 = resname[2];
                  if (sVar12 != 1) goto LAB_0012a6cd;
                  uVar2 = CONCAT11(resname[8],resname[7]);
                  uVar3 = CONCAT11(resname[2],resname[1]);
                  if ((uVar2 != 0) &&
                     (sVar12 = fread(resname + 9,(ulong)((uint)uVar2 * 2),1,pFVar10), sVar12 != 1))
                  goto LAB_0012a6cd;
                  vociadd(vctx,uVar3,CONCAT11(resname[4],resname[3]),(uint)uVar2,
                          (objnum *)(resname + 9),(byte)resname[0] | 4);
                  (vctx->voccxinh[(byte)cVar5][uVar3 & 0xff]->vociu).vocius.vociusilc =
                       CONCAT11(resname[6],resname[5]);
                  uVar23 = (ulong)uVar2 * 2 + 9 + uVar23;
                } while (uVar23 != uVar26);
              }
              goto LAB_00128b13;
            }
            if (resname[3] == 'Q' && CONCAT11(resname[2],resname[1]) == 0x4552) {
              lVar13 = ftell(pFVar10);
              uVar25 = ((int)uVar11 - (int)lVar13) + uVar25;
              sVar12 = fread(resname,(ulong)uVar25,1,pFVar10);
              if (sVar12 != 1) goto LAB_0012a6cd;
              vctx->voccxme_init = CONCAT11(resname[1],resname[0]);
              vctx->voccxme = CONCAT11(resname[1],resname[0]);
              vctx->voccxvtk = CONCAT11(resname[3],resname[2]);
              vctx->voccxstr = CONCAT11(resname[5],resname[4]);
              vctx->voccxnum =
                   (short)(CONCAT13(resname[7],CONCAT12(resname[6],CONCAT11(resname[5],resname[4])))
                          >> 0x10);
              vctx->voccxprd = CONCAT11(resname[9],resname[8]);
              vctx->voccxvag = (short)CONCAT21(resname._11_2_,resname[10]);
              vctx->voccxini =
                   (short)(CONCAT13(resname[0xd],CONCAT21(resname._11_2_,resname[10])) >> 0x10);
              vctx->voccxpre = resname._14_2_;
              vctx->voccxper = CONCAT11(resname[0x11],resname[0x10]);
              oVar6 = 0xffff;
              if (0x13 < (int)uVar25) {
                oVar6 = resname._18_2_;
              }
              vctx->voccxprom = oVar6;
              if ((int)uVar25 < 0x1a) {
                vctx->voccxpdis = 0xffff;
                vctx->voccxper2 = 0xffff;
                oVar6 = 0xffff;
              }
              else {
                *(undefined4 *)&vctx->voccxpdis = resname._20_4_;
                oVar6 = resname._24_2_;
              }
              vctx->voccxpdef = oVar6;
              oVar6 = 0xffff;
              if (0x1b < (int)uVar25) {
                oVar6 = resname._26_2_;
              }
              vctx->voccxpask = oVar6;
              oVar6 = 0xffff;
              if (0x1d < (int)uVar25) {
                oVar6 = resname._28_2_;
              }
              vctx->voccxppc = oVar6;
              oVar6 = 0xffff;
              if (0x1f < (int)uVar25) {
                oVar6 = resname._30_2_;
              }
              vctx->voccxpask2 = oVar6;
              oVar6 = 0xffff;
              if (0x21 < (int)uVar25) {
                oVar6 = resname._32_2_;
              }
              vctx->voccxperp = oVar6;
              if ((int)uVar25 < 0x26) {
                vctx->voccxpostprom = 0xffff;
                oVar6 = 0xffff;
              }
              else {
                vctx->voccxpostprom = resname._34_2_;
                oVar6 = resname._36_2_;
              }
              vctx->voccxinitrestore = oVar6;
              if ((int)uVar25 < 0x2a) {
                vctx->voccxpuv = 0xffff;
                oVar6 = 0xffff;
              }
              else {
                vctx->voccxpuv = resname._38_2_;
                oVar6 = resname._40_2_;
              }
              vctx->voccxpnp = oVar6;
              if ((int)uVar25 < 0x30) {
                oVar6 = 0xffff;
                vctx->voccxpostact = 0xffff;
                vctx->voccxendcmd = 0xffff;
              }
              else {
                vctx->voccxpostact = resname._42_2_;
                vctx->voccxendcmd = resname._44_2_;
                oVar6 = resname._46_2_;
              }
              vctx->voccxprecmd = oVar6;
              oVar6 = 0xffff;
              if (0x31 < (int)uVar25) {
                oVar6 = resname._48_2_;
              }
              vctx->voccxpask3 = oVar6;
              if ((int)uVar25 < 0x36) {
                oVar6 = 0xffff;
                vctx->voccxpre2 = 0xffff;
              }
              else {
                vctx->voccxpre2 = resname._50_2_;
                oVar6 = resname._52_2_;
              }
              vctx->voccxpdef2 = oVar6;
              goto LAB_00128b13;
            }
            if (resname[3] == 'C' && CONCAT11(resname[2],resname[1]) == 0x4f56) {
              lVar13 = ftell(pFVar10);
              uVar23 = lVar13 - uVar11;
              sVar12 = uVar26 - uVar23;
              if ((sVar12 - 1 < 0xfffffffe) &&
                 (__ptr = (ushort *)malloc(sVar12), __ptr != (ushort *)0x0)) {
                __ptr_00 = __ptr;
                uVar26 = sVar12;
                if (sVar12 != 0) {
                  do {
                    sVar9 = 0xffff;
                    if (uVar26 < 0xffff) {
                      sVar9 = uVar26;
                    }
                    sVar15 = fread(__ptr_00,sVar9,1,pFVar10);
                    if (sVar15 != 1) goto LAB_0012a6cd;
                    uVar26 = uVar26 - sVar9;
                    __ptr_00 = (ushort *)((long)__ptr_00 + sVar9);
                    puVar27 = __ptr;
                  } while (uVar26 != 0);
                  do {
                    uVar25 = (uint)*puVar27;
                    uVar3 = puVar27[1];
                    if ((*flagp & 8) != 0) {
                      fioxor((uchar *)(puVar27 + 5),uVar3 + uVar25,uVar20,inc);
                    }
                    puVar16 = (uchar *)0x0;
                    if (uVar3 != 0) {
                      puVar16 = (uchar *)((long)puVar27 + (ulong)uVar25 + 10);
                    }
                    vocadd2(vctx,puVar27[2],puVar27[3],(uint)puVar27[4],(uchar *)(puVar27 + 5),
                            uVar25,puVar16,(uint)uVar3);
                    uVar26 = (ulong)(uVar3 + uVar25);
                    sVar12 = sVar12 - (uVar26 + 10);
                    puVar27 = (ushort *)((long)puVar27 + uVar26 + 10);
                  } while (sVar12 != 0);
                }
                free(__ptr);
              }
              else {
                for (; uVar26 != uVar23; uVar23 = uVar25 + uVar23 + 10) {
                  sVar12 = fread(resname,10,1,pFVar10);
                  if (sVar12 != 1) goto LAB_0012a6cd;
                  uVar3 = CONCAT11(resname[1],resname[0]);
                  uVar2 = CONCAT11(resname[3],resname[2]);
                  uVar25 = (uint)uVar2 + (uint)uVar3;
                  sVar12 = fread(resname + 10,(ulong)uVar25,1,pFVar10);
                  if (sVar12 != 1) goto LAB_0012a6cd;
                  if ((*flagp & 8) != 0) {
                    fioxor((uchar *)(resname + 10),uVar25,uVar20,inc);
                  }
                  puVar16 = (uchar *)0x0;
                  if (uVar2 != 0) {
                    puVar16 = (uchar *)(resname + 10 + uVar3);
                  }
                  vocadd2(vctx,CONCAT11(resname[5],resname[4]),CONCAT11(resname[7],resname[6]),
                          (uint)CONCAT11(resname[9],resname[8]),(uchar *)(resname + 10),(uint)uVar3,
                          puVar16,(uint)uVar2);
                }
              }
              goto LAB_00128b13;
            }
          }
          if ((resname[0] == '\x06') &&
             (CONCAT11(resname[6],resname[5]) == 0x5254 &&
              CONCAT13(resname[4],CONCAT12(resname[3],CONCAT11(resname[2],resname[1]))) ==
              0x53544d46)) {
            sVar12 = fread(resname,2,1,pFVar10);
            if (sVar12 != 1) goto LAB_0012a6cd;
            uVar3 = CONCAT11(resname[1],resname[0]);
            puVar16 = mchalo(vctx->voccxerr,(ulong)uVar3,"fiord1");
            sVar12 = fread(puVar16,(ulong)uVar3,1,pFVar10);
            if (sVar12 != 1) goto LAB_0012a6cd;
            if ((*flagp & 8) != 0) {
              fioxor(puVar16,(uint)uVar3,uVar20,inc);
            }
            tiosetfmt(vctx->voccxtio,vctx->voccxrun,puVar16,(uint)uVar3);
            if (fmtsp != (uchar **)0x0) {
              *fmtsp = puVar16;
            }
            if (fmtlp != (uint *)0x0) {
              *fmtlp = (uint)uVar3;
            }
            goto LAB_00128b13;
          }
          if ((resname[0] == '\x04') &&
             (CONCAT13(resname[4],CONCAT12(resname[3],CONCAT11(resname[2],resname[1]))) ==
              0x44504d43)) {
            sVar12 = fread(resname,2,1,pFVar10);
            if (sVar12 != 1) goto LAB_0012a6cd;
            vctx->voccxcpl = (uint)CONCAT11(resname[1],resname[0]);
            puVar16 = mchalo(vctx->voccxerr,(ulong)(uint)CONCAT11(resname[1],resname[0]),"fiord1");
            vctx->voccxcpp = (char *)puVar16;
            sVar12 = fread(puVar16,(ulong)(uint)vctx->voccxcpl,1,pFVar10);
            if (sVar12 != 1) goto LAB_0012a6cd;
            if ((*flagp & 8) == 0) goto LAB_00128b13;
            puVar16 = (uchar *)vctx->voccxcpp;
            uVar7 = vctx->voccxcpl;
          }
          else {
            if ((resname[0] != '\b') ||
               (CONCAT17(resname[8],
                         CONCAT16(resname[7],
                                  CONCAT15(resname[6],
                                           CONCAT14(resname[5],
                                                    CONCAT13(resname[4],
                                                             CONCAT12(resname[3],
                                                                      CONCAT11(resname[2],resname[1]
                                                                              ))))))) !=
                0x44524f5743455053)) {
              if ((resname[0] != '\x06') ||
                 (CONCAT11(resname[6],resname[5]) != 0x4241 ||
                  CONCAT13(resname[4],CONCAT12(resname[3],CONCAT11(resname[2],resname[1]))) !=
                  0x544d5953)) {
                if ((resname[0] == '\x03') &&
                   (resname[3] == 'C' && CONCAT11(resname[2],resname[1]) == 0x5253)) {
                  if (vctx->voccxrun->runcxdbg == (dbgcxdef *)0x0) goto LAB_00128d24;
                  while (lVar13 = ftell(pFVar10), lVar13 - uVar11 != uVar26) {
                    iVar8 = linfload((osfildef *)pFVar10,vctx->voccxrun->runcxdbg,ctx,path);
                    if (iVar8 != 0) goto LAB_0012a6cd;
                  }
                  goto LAB_00128b13;
                }
                if ((resname[0] == '\x04') &&
                   (CONCAT13(resname[4],CONCAT12(resname[3],CONCAT11(resname[2],resname[1]))) ==
                    0x32435253)) {
                  pdVar4 = vctx->voccxrun->runcxdbg;
                  if (pdVar4 != (dbgcxdef *)0x0) {
                    piVar1 = &pdVar4->dbgcxflg;
                    *(byte *)piVar1 = (byte)*piVar1 | 0x40;
                  }
                  goto LAB_0012a111;
                }
                if ((resname[0] == '\a') &&
                   (CONCAT13(resname[7],CONCAT12(resname[6],CONCAT11(resname[5],resname[4]))) ==
                    0x54494e49 &&
                    CONCAT13(resname[4],CONCAT12(resname[3],CONCAT11(resname[2],resname[1]))) ==
                    0x49455250)) {
                  sVar12 = fread(resname,2,1,pFVar10);
                  if (sVar12 != 1) goto LAB_0012a6cd;
                  *preinit = CONCAT11(resname[1],resname[0]);
                  goto LAB_00128b13;
                }
                if (resname[0] == '\x06') {
                  if (CONCAT11(resname[6],resname[5]) == 0x4753 &&
                      CONCAT13(resname[4],CONCAT12(resname[3],CONCAT11(resname[2],resname[1]))) ==
                      0x4d525245) {
                    errini(ctx,(osfildef *)pFVar10);
                    goto LAB_0012a111;
                  }
                  if (CONCAT11(resname[6],resname[5]) == 0x544e &&
                      CONCAT13(resname[4],CONCAT12(resname[3],CONCAT11(resname[2],resname[1]))) ==
                      0x43545845) {
                    lVar13 = ftell(pFVar10);
                    sVar12 = fread(resname,2,1,pFVar10);
                    if (sVar12 != 1) goto LAB_0012a6cd;
                    uVar3 = CONCAT11(resname[1],resname[0]);
                    uVar23 = (ulong)((uint)uVar3 * 0x30 & 0xffff);
                    prVar17 = (runxdef *)mchalo(ctx,uVar23,"fiord:runxdef");
                    memset(prVar17,0,uVar23);
                    vctx->voccxrun->runcxext = prVar17;
                    vctx->voccxrun->runcxexc = (uint)uVar3;
                    if (5 < (uVar26 + uVar11) - lVar13) {
                      sVar12 = fread(resname,4,1,pFVar10);
                      if (sVar12 != 1) goto LAB_0012a6cd;
                      uVar18 = (ulong)CONCAT13(resname[3],
                                               CONCAT12(resname[2],CONCAT11(resname[1],resname[0])))
                      ;
                    }
                    fseek(pFVar10,uVar26 + uVar11,0);
                    goto LAB_00128b13;
                  }
                  if (CONCAT11(resname[6],resname[5]) == 0x544e &&
                      CONCAT13(resname[4],CONCAT12(resname[3],CONCAT11(resname[2],resname[1]))) ==
                      0x43505250) {
                    sVar12 = fread(resname,2,1,pFVar10);
                    if (sVar12 != 1) goto LAB_0012a6cd;
                    if (pcntptr != (uint *)0x0) {
                      *pcntptr = (uint)CONCAT11(resname[1],resname[0]);
                    }
                    goto LAB_00128b13;
                  }
                  if ((tctx != (tokcxdef *)0x0) &&
                     (CONCAT11(resname[6],resname[5]) == 0x5050 &&
                      CONCAT13(resname[4],CONCAT12(resname[3],CONCAT11(resname[2],resname[1]))) ==
                      0x53444154)) {
                    tok_read_defines(tctx,(osfildef *)pFVar10,ctx);
                    goto LAB_00128b13;
                  }
                }
                if ((resname[0] == '\x03') &&
                   (resname[3] == 'I' && CONCAT11(resname[2],resname[1]) == 0x5358)) {
                  sVar12 = fread(resname,2,1,pFVar10);
                  if (sVar12 != 1) goto LAB_0012a6cd;
                  uVar20 = (uint)(byte)resname[0];
                  setupctx->fiolcxseed = uVar20;
                  inc = (uint)(byte)resname[1];
                  setupctx->fiolcxinc = inc;
                  fseek(pFVar10,uVar26 + uVar11,0);
                }
                else if ((resname[0] == '\x06') &&
                        (CONCAT11(resname[6],resname[5]) == 0x5445 &&
                         CONCAT13(resname[4],CONCAT12(resname[3],CONCAT11(resname[2],resname[1])))
                         == 0x53524843)) {
                  sVar12 = fread(resname,6,1,pFVar10);
                  if (((sVar12 != 1) || (0x28 < (ulong)CONCAT11(resname[5],resname[4]))) ||
                     (sVar12 = fread(resname + 6,(ulong)CONCAT11(resname[5],resname[4]),1,pFVar10),
                     sVar12 != 1)) goto LAB_0012a6cd;
                  resname[4] = '\0';
                  cmap_set_game_charset(ctx,resname,resname + 6,argv0);
                }
                else {
                  if ((resname[0] != '\x04') ||
                     (CONCAT13(resname[4],CONCAT12(resname[3],CONCAT11(resname[2],resname[1]))) !=
                      0x464f4524)) goto LAB_0012a736;
                  if (__off == 0) {
                    if ((appctx == (appctxdef *)0x0) ||
                       (appctx->add_resfile == (_func_int_void_ptr_char_ptr *)0x0))
                    goto LAB_0012a694;
                    suffix_uc[0] = 'R';
                    suffix_uc[1] = 'S';
                    suffix_uc[3] = '\0';
                    suffix_lc[0] = 'r';
                    suffix_lc[1] = 's';
                    suffix_lc[3] = '\0';
                    iVar8 = 0;
                    goto LAB_0012a3c9;
                  }
                  fseek(pFVar10,__off,0);
                  __off = 0;
                }
                goto LAB_00128b13;
              }
              pdVar4 = vctx->voccxrun->runcxdbg;
              if (pdVar4 == (dbgcxdef *)0x0) {
                fseek(pFVar10,uVar26 + uVar11,0);
              }
              else {
                toktab1 = pdVar4->dbgcxtab;
                if (toktab1 == (tokthdef *)0x0) {
                  toktab1 = (tokthdef *)mchalo(ctx,0xb50,"fiord:symtab");
                  tokthini(ctx,mctx,(toktdef *)toktab1);
                  vctx->voccxrun->runcxdbg->dbgcxtab = toktab1;
                }
                sVar12 = fread(resname,4,1,pFVar10);
                while( true ) {
                  if (sVar12 != 1) goto LAB_0012a6cd;
                  if ((ulong)(byte)resname[0] == 0) break;
                  pcVar21 = resname + 4;
                  sVar12 = fread(pcVar21,(ulong)(byte)resname[0],1,pFVar10);
                  if (sVar12 != 1) goto LAB_0012a6cd;
                  resname[(ulong)(byte)resname[0] + 4] = '\0';
                  uVar7 = tokhsh(pcVar21);
                  (*(toktab1->tokthsc).toktfadd)
                            (&toktab1->tokthsc,pcVar21,(int)resname[0],(int)resname[1],
                             (int)CONCAT11(resname[3],resname[2]),uVar7);
                  sVar12 = fread(resname,4,1,pFVar10);
                }
              }
              goto LAB_00128b13;
            }
            sVar12 = fread(resname,2,1,pFVar10);
            if (sVar12 != 1) goto LAB_0012a6cd;
            vctx->voccxspl = (uint)CONCAT11(resname[1],resname[0]);
            puVar16 = mchalo(vctx->voccxerr,(ulong)(uint)CONCAT11(resname[1],resname[0]),"fiord1");
            vctx->voccxspp = (char *)puVar16;
            sVar12 = fread(puVar16,(ulong)(uint)vctx->voccxspl,1,pFVar10);
            if (sVar12 != 1) goto LAB_0012a6cd;
            if ((*flagp & 8) == 0) goto LAB_00128b13;
            puVar16 = (uchar *)vctx->voccxspp;
            uVar7 = vctx->voccxspl;
          }
          fioxor(puVar16,uVar7,uVar20,inc);
          goto LAB_00128b13;
        }
        fiordhtml(ctx,(osfildef *)pFVar10,appctx,0,pcVar19);
      }
LAB_0012a111:
      fseek(pFVar10,uVar26 + uVar11,0);
      goto LAB_00128b13;
    }
  }
LAB_0012a6cd:
  errsigf(ctx,"TADS",0x25f);
LAB_0012a3c9:
  pcVar21 = appctx->ext_res_path;
  if (pcVar21 == (char *)0x0) {
    if (pcVar19 == (char *)0x0) {
      resname[0] = '\0';
    }
    else {
      strcpy(resname,pcVar19);
    }
  }
  else {
    filename = os_get_root_name(pcVar19);
    os_build_full_path(resname,0x1000,pcVar21,filename);
  }
  os_remext(resname);
  suffix_uc[2] = (byte)iVar8 | 0x30;
  suffix_lc[2] = suffix_uc[2];
  os_addext(resname,suffix_lc);
  pFVar10 = fopen(resname,"rb");
  if (pFVar10 == (FILE *)0x0) {
    os_remext(resname);
    os_addext(resname,suffix_uc);
    pFVar10 = fopen(resname,"rb");
  }
  if (pFVar10 != (FILE *)0x0) {
    resfileno = (*appctx->add_resfile)(appctx->add_resfile_ctx,resname);
    ctx = vctx->voccxerr;
    lVar13 = ftell(pFVar10);
    sVar12 = fread(local_11c8,0x16,1,pFVar10);
    if (sVar12 != 1) {
LAB_0012a6d7:
      sVar12 = strlen(resname);
      pcVar19 = errstr(ctx,resname,(int)sVar12);
      ctx->errcxptr->erraav[0].errastr = pcVar19;
      ctx->errcxptr->erraac = 1;
      errsign(ctx,0x26a,"TADS");
    }
    if (CONCAT53(uStack_11c0,iStack_11c4._1_3_) != 0x1a0d0a63737220 ||
        CONCAT44(iStack_11c4,local_11c8) != 0x7372203253444154) {
      sVar12 = strlen(resname);
      pcVar19 = errstr(ctx,resname,(int)sVar12);
      ctx->errcxptr->erraav[0].errastr = pcVar19;
      ctx->errcxptr->erraac = 1;
      errsign(ctx,0x269,"TADS");
    }
    if (((CONCAT31(uStack_11b7,local_11bb._3_1_) != 0x302e32 || local_11bb != 0x322e3276) &&
        (CONCAT31(uStack_11b7,local_11bb._3_1_) != 0x302e30 || local_11bb != 0x302e3276)) &&
       (CONCAT31(uStack_11b7,local_11bb._3_1_) != 0x312e30 || local_11bb != 0x302e3276))
    goto LAB_0012a7d7;
    sVar12 = fread(local_11c8,0x1a,1,pFVar10);
    if (sVar12 != 1) goto LAB_0012a6d7;
    while( true ) {
      sVar12 = fread(local_11c8,1,1,pFVar10);
      if (sVar12 != 1) goto LAB_0012a6d7;
      sVar12 = fread(local_11c8 + 1,(ulong)local_11c8[0] + 4,1,pFVar10);
      if (sVar12 != 1) goto LAB_0012a6d7;
      if (((uint)local_11c8 & 0xff) != 7) {
        if (((uint)local_11c8 & 0xff) == 4) goto LAB_0012a64e;
        goto LAB_0012a736;
      }
      if (iStack_11c4 != 0x5345524c ||
          CONCAT13((undefined1)iStack_11c4,local_11c8._1_3_) != 0x4c4d5448) break;
      uVar20 = *(uint *)(local_11c8 + (ulong)local_11c8[0] + 1);
      fiordhtml(ctx,(osfildef *)pFVar10,appctx,resfileno,resname);
      fseek(pFVar10,(ulong)uVar20 + lVar13,0);
    }
    if (local_11c8[0] != 4) {
LAB_0012a736:
      errsigf(ctx,"TADS",0x261);
    }
LAB_0012a64e:
    if (CONCAT13((undefined1)iStack_11c4,local_11c8._1_3_) != 0x464f4524) goto LAB_0012a736;
    fclose(pFVar10);
  }
  iVar8 = iVar8 + 1;
  if (iVar8 == 9) {
LAB_0012a694:
    vctx->voccxerr->errcxptr = fr_.errprv;
    return;
  }
  goto LAB_0012a3c9;
}

Assistant:

void fiord(mcmcxdef *mctx, voccxdef *vctx, tokcxdef *tctx, char *fname,
           char *exename, fiolcxdef *setupctx, objnum *preinit, uint *flagp,
           tokpdef *path, uchar **fmtsp, uint *fmtlp, uint *pcntptr,
           int flags, struct appctxdef *appctx, char *argv0)
{
    osfildef *fp;
    ulong     startofs;
    char     *display_fname;
    
    /* presume there will be no need to run preinit */
    *preinit = MCMONINV;

    /* 
     *   get the display filename - use the real filename if one is
     *   provided, otherwise use the name of the executable file itself 
     */
    display_fname = (fname != 0 ? fname : exename);

    /* save the filename in G_os_gamename */
    if (display_fname != 0)
    {
        size_t copylen;

        /* limit the copy to the buffer size */
        if ((copylen = strlen(display_fname)) > sizeof(G_os_gamename) - 1)
            copylen = sizeof(G_os_gamename) - 1;

        /* save it */
        memcpy(G_os_gamename, display_fname, copylen);
        G_os_gamename[copylen] = '\0';
    }
    else
        G_os_gamename[0] = '\0';
    
    /* open the file and read and check file header */
    fp = (fname != 0 ? osfoprb(fname, OSFTGAME)
                     : os_exeseek(exename, "TGAM"));
    if (fp == 0)
        errsig(vctx->voccxerr, ERR_OPRGAM);

    /* 
     *   we've identified the .GAM file source - tell the host system
     *   about it, if it's interested 
     */
    if (appctx != 0 && appctx->set_game_name != 0)
        (*appctx->set_game_name)(appctx->set_game_name_ctx, display_fname);

    /* remember starting location in file */
    startofs = osfpos(fp);

    ERRBEGIN(vctx->voccxerr)

    /* 
     *   Read the game file.  Note that the .GAM file always has resource
     *   file number zero. 
     */
    fiord1(mctx, vctx, tctx, fp, display_fname,
           setupctx, startofs, preinit, flagp, path,
           fmtsp, fmtlp, pcntptr, flags, appctx, argv0);

    /*
     *   If the host system accepts additional resource files, look for
     *   additional resource files.  These are files in the same directory
     *   as the .GAM file, with the .GAM suffix replaced by suffixes from
     *.  RS0 to .RS9.  
     */
    if (appctx != 0 && appctx->add_resfile != 0)
    {
        char suffix_lc[4];
        char suffix_uc[4];
        int i;
        char *base_name;

        /* use the game or executable filename, as appropriate */
        base_name = display_fname;

        /* build the initial suffixes - try both upper- and lower-case */
        suffix_uc[0] = 'R';
        suffix_uc[1] = 'S';
        suffix_uc[3] = '\0';
        suffix_lc[0] = 'r';
        suffix_lc[1] = 's';
        suffix_lc[3] = '\0';

        /* loop through each possible suffix (.RS0 through .RS9) */
        for (i = 0 ; i < 9 ; ++i)
        {
            char resname[OSFNMAX];
            osfildef *fpres;
            int resfileno;

            /* 
             *   Build the next resource filename.  If there's an explicit
             *   resource path, use it, otherwise use the same directory
             *   that contains the .GAM file. 
             */
            if (appctx->ext_res_path != 0)
            {
                /*
                 *   There's an explicit resource path - append the root
                 *   (filename-only, minus path) portion of the .GAM file
                 *   name to the resource path. 
                 */
                os_build_full_path(resname, sizeof(resname),
                                   appctx->ext_res_path,
                                   os_get_root_name(base_name));
            }
            else
            {
                /* 
                 *   there's no resource path - use the entire .GAM
                 *   filename, including directory, so that we look in the
                 *   same directory that contains the .GAM file 
                 */
                if (base_name != 0)
                    strcpy(resname, base_name);
                else
                    resname[0] = '\0';
            }

            /* add the current extension (replacing any current extension) */
            os_remext(resname);
            suffix_lc[2] = suffix_uc[2] = '0' + i;
            os_addext(resname, suffix_lc);

            /* try opening the file */
            fpres = osfoprb(resname, OSFTGAME);

            /* if that didn't work, try the upper-case name */
            if (fpres == 0)
            {
                /* replace the suffix with the upper-case version */
                os_remext(resname);
                os_addext(resname, suffix_uc);

                /* try again with the new name */
                fpres = osfoprb(resname, OSFTGAME);
            }

            /* if we opened it successfully, read it */
            if (fpres != 0)
            {
                /* tell the host system about it */
                resfileno = (*appctx->add_resfile)
                            (appctx->add_resfile_ctx, resname);

                /* read the file */
                fiordrscext(vctx->voccxerr, fpres, appctx,
                            resfileno, resname);

                /* we're done with the file, so close it */
                osfcls(fpres);
            }
        }
    }

    ERRCLEAN(vctx->voccxerr)
        /* if an error occurs during read, clean up by closing the file */
        osfcls(fp);
    ERRENDCLN(vctx->voccxerr);
}